

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O3

SmodelsOutput * __thiscall
Potassco::SmodelsOutput::add(SmodelsOutput *this,Weight_t bnd,WeightLitSpan *lits,bool card)

{
  size_t sVar1;
  ostream *poVar2;
  WeightLit_t *pWVar3;
  int iVar4;
  WeightLit_t *pWVar5;
  Weight_t *pWVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  sVar1 = lits->size;
  if (sVar1 == 0) {
    iVar7 = 0;
  }
  else {
    pWVar3 = lits->first;
    pWVar5 = pWVar3 + sVar1;
    iVar7 = 0;
    do {
      iVar10 = -pWVar3->lit;
      if (-1 < pWVar3->weight) {
        iVar10 = pWVar3->lit;
      }
      iVar7 = iVar7 - (iVar10 >> 0x1f);
      pWVar3 = pWVar3 + 1;
    } while (pWVar3 != pWVar5);
  }
  poVar2 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  if (card) {
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = this->os_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = this->os_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  poVar2 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = this->os_;
  iVar8 = (int)sVar1 - iVar7;
  pWVar5 = lits->first;
  iVar9 = iVar7;
  iVar10 = iVar8;
  if (iVar7 != 0) {
    do {
      iVar4 = -pWVar5->lit;
      if (-1 < pWVar5->weight) {
        iVar4 = pWVar5->lit;
      }
      if (iVar4 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        iVar9 = iVar9 + -1;
      }
      pWVar5 = pWVar5 + 1;
    } while (iVar9 != 0);
    pWVar5 = lits->first;
  }
  while (iVar10 != 0) {
    iVar9 = -pWVar5->lit;
    if (-1 < pWVar5->weight) {
      iVar9 = pWVar5->lit;
    }
    if (-1 < iVar9) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      iVar10 = iVar10 + -1;
    }
    pWVar5 = pWVar5 + 1;
  }
  if (!card) {
    poVar2 = this->os_;
    pWVar5 = lits->first;
    if (iVar7 != 0) {
      pWVar6 = &pWVar5->weight;
      do {
        iVar10 = -((WeightLit_t *)(pWVar6 + -1))->lit;
        if (-1 < *pWVar6) {
          iVar10 = ((WeightLit_t *)(pWVar6 + -1))->lit;
        }
        if (iVar10 < 0) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          iVar7 = iVar7 + -1;
        }
        pWVar6 = pWVar6 + 2;
      } while (iVar7 != 0);
      pWVar5 = lits->first;
    }
    if (iVar8 != 0) {
      pWVar6 = &pWVar5->weight;
      do {
        iVar7 = -((WeightLit_t *)(pWVar6 + -1))->lit;
        if (-1 < *pWVar6) {
          iVar7 = ((WeightLit_t *)(pWVar6 + -1))->lit;
        }
        if (-1 < iVar7) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          iVar8 = iVar8 + -1;
        }
        pWVar6 = pWVar6 + 2;
      } while (iVar8 != 0);
    }
  }
  return this;
}

Assistant:

SmodelsOutput& SmodelsOutput::add(Weight_t bnd, const WeightLitSpan& lits, bool card) {
	unsigned neg = negSize(lits), size = static_cast<unsigned>(Potassco::size(lits));
	if (!card) { add(static_cast<unsigned>(bnd)); }
	add(size).add(neg);
	if (card)  { add(static_cast<unsigned>(bnd)); }
	print(os_, lits, neg, size - neg, Atom());
	if (!card) { print(os_, lits, neg, size - neg, SmWeight()); }
	return *this;
}